

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  bool bVar1;
  FieldType FVar2;
  int iVar3;
  uint uVar4;
  LogMessage *other;
  size_t sVar5;
  int *piVar6;
  uint *puVar7;
  undefined4 extraout_var;
  Type *pTVar8;
  long *plVar9;
  void *pvVar10;
  size_t sVar11;
  ulong *puVar12;
  unsigned_long *puVar13;
  Type *pTVar14;
  undefined4 extraout_var_00;
  long lVar15;
  ulong uVar16;
  RepeatedField<unsigned_int> *this_00;
  RepeatedField<int> *pRVar17;
  RepeatedField<long> *pRVar18;
  RepeatedField<unsigned_long> *this_01;
  string *psVar19;
  int i;
  int iVar20;
  int i_7;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (this->is_repeated == true) {
    bVar1 = this->is_packed;
    FVar2 = anon_unknown_22::real_type(this->type);
    if (bVar1 != true) {
      sVar5 = WireFormatLite::TagSize(number,FVar2);
      FVar2 = anon_unknown_22::real_type(this->type);
      switch(FVar2) {
      case TYPE_DOUBLE:
      case TYPE_FIXED64:
      case TYPE_SFIXED64:
        lVar15 = sVar5 + 8;
        break;
      case TYPE_FLOAT:
      case TYPE_FIXED32:
      case TYPE_SFIXED32:
        lVar15 = sVar5 + 4;
        break;
      case TYPE_INT64:
        pRVar18 = (this->field_0).repeated_int64_value;
        uVar16 = (ulong)(uint)pRVar18->current_size_;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          puVar12 = (ulong *)RepeatedField<long>::Get(pRVar18,iVar20);
          lVar15 = 0x3f;
          if ((*puVar12 | 1) != 0) {
            for (; (*puVar12 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
            }
          }
          sVar5 = sVar5 + ((int)lVar15 * 9 + 0x49U >> 6);
          pRVar18 = (this->field_0).repeated_int64_value;
          uVar16 = (ulong)(uint)pRVar18->current_size_;
        }
        return sVar5;
      case TYPE_UINT64:
        this_01 = (this->field_0).repeated_uint64_value;
        uVar16 = (ulong)(uint)this_01->current_size_;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          puVar13 = RepeatedField<unsigned_long>::Get(this_01,iVar20);
          lVar15 = 0x3f;
          if ((*puVar13 | 1) != 0) {
            for (; (*puVar13 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
            }
          }
          sVar5 = sVar5 + ((int)lVar15 * 9 + 0x49U >> 6);
          this_01 = (this->field_0).repeated_uint64_value;
          uVar16 = (ulong)(uint)this_01->current_size_;
        }
        return sVar5;
      case TYPE_INT32:
        pRVar17 = (this->field_0).repeated_int32_value;
        uVar16 = (ulong)(uint)pRVar17->current_size_;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          piVar6 = RepeatedField<int>::Get(pRVar17,iVar20);
          sVar11 = io::CodedOutputStream::VarintSize32SignExtended(*piVar6);
          sVar5 = sVar5 + sVar11;
          pRVar17 = (this->field_0).repeated_int32_value;
          uVar16 = (ulong)(uint)pRVar17->current_size_;
        }
        return sVar5;
      case TYPE_BOOL:
        lVar15 = sVar5 + 1;
        break;
      case TYPE_STRING:
        psVar19 = (this->field_0).string_value;
        uVar16 = (ulong)(uint)psVar19->_M_string_length;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          pTVar14 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              ((RepeatedPtrFieldBase *)psVar19,iVar20);
          sVar11 = WireFormatLite::StringSize(pTVar14);
          sVar5 = sVar5 + sVar11;
          psVar19 = (this->field_0).string_value;
          uVar16 = (ulong)(uint)psVar19->_M_string_length;
        }
        return sVar5;
      case TYPE_GROUP:
        psVar19 = (this->field_0).string_value;
        uVar16 = (ulong)(uint)psVar19->_M_string_length;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          pTVar8 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)psVar19,iVar20);
          iVar3 = (*pTVar8->_vptr_MessageLite[9])(pTVar8);
          sVar5 = sVar5 + CONCAT44(extraout_var,iVar3);
          psVar19 = (this->field_0).string_value;
          uVar16 = (ulong)(uint)psVar19->_M_string_length;
        }
        return sVar5;
      case TYPE_MESSAGE:
        psVar19 = (this->field_0).string_value;
        uVar16 = (ulong)(uint)psVar19->_M_string_length;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          pTVar8 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)psVar19,iVar20);
          sVar11 = WireFormatLite::MessageSize<google::protobuf::MessageLite>(pTVar8);
          sVar5 = sVar5 + sVar11;
          psVar19 = (this->field_0).string_value;
          uVar16 = (ulong)(uint)psVar19->_M_string_length;
        }
        return sVar5;
      case TYPE_BYTES:
        psVar19 = (this->field_0).string_value;
        uVar16 = (ulong)(uint)psVar19->_M_string_length;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          pTVar14 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              ((RepeatedPtrFieldBase *)psVar19,iVar20);
          sVar11 = WireFormatLite::BytesSize(pTVar14);
          sVar5 = sVar5 + sVar11;
          psVar19 = (this->field_0).string_value;
          uVar16 = (ulong)(uint)psVar19->_M_string_length;
        }
        return sVar5;
      case TYPE_UINT32:
        this_00 = (this->field_0).repeated_uint32_value;
        uVar16 = (ulong)(uint)this_00->current_size_;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          puVar7 = RepeatedField<unsigned_int>::Get(this_00,iVar20);
          iVar3 = 0x1f;
          if ((*puVar7 | 1) != 0) {
            for (; (*puVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          sVar5 = sVar5 + (iVar3 * 9 + 0x49U >> 6);
          this_00 = (this->field_0).repeated_uint32_value;
          uVar16 = (ulong)(uint)this_00->current_size_;
        }
        return sVar5;
      case TYPE_ENUM:
        pRVar17 = (this->field_0).repeated_int32_value;
        uVar16 = (ulong)(uint)pRVar17->current_size_;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          piVar6 = RepeatedField<int>::Get(pRVar17,iVar20);
          sVar11 = io::CodedOutputStream::VarintSize32SignExtended(*piVar6);
          sVar5 = sVar5 + sVar11;
          pRVar17 = (this->field_0).repeated_int32_value;
          uVar16 = (ulong)(uint)pRVar17->current_size_;
        }
        return sVar5;
      case TYPE_SINT32:
        pRVar17 = (this->field_0).repeated_int32_value;
        uVar16 = (ulong)(uint)pRVar17->current_size_;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          piVar6 = RepeatedField<int>::Get(pRVar17,iVar20);
          sVar11 = WireFormatLite::SInt32Size(*piVar6);
          sVar5 = sVar5 + sVar11;
          pRVar17 = (this->field_0).repeated_int32_value;
          uVar16 = (ulong)(uint)pRVar17->current_size_;
        }
        return sVar5;
      case MAX_FIELD_TYPE:
        pRVar18 = (this->field_0).repeated_int64_value;
        uVar16 = (ulong)(uint)pRVar18->current_size_;
        sVar5 = sVar5 * uVar16;
        for (iVar20 = 0; iVar20 < (int)uVar16; iVar20 = iVar20 + 1) {
          plVar9 = RepeatedField<long>::Get(pRVar18,iVar20);
          sVar11 = WireFormatLite::SInt64Size(*plVar9);
          sVar5 = sVar5 + sVar11;
          pRVar18 = (this->field_0).repeated_int64_value;
          uVar16 = (ulong)(uint)pRVar18->current_size_;
        }
        return sVar5;
      default:
        return 0;
      }
      return lVar15 * (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
    }
    switch(FVar2) {
    case TYPE_DOUBLE:
    case TYPE_FIXED64:
    case TYPE_SFIXED64:
      uVar16 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 3;
      break;
    case TYPE_FLOAT:
    case TYPE_FIXED32:
    case TYPE_SFIXED32:
      uVar16 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 2;
      break;
    case TYPE_INT64:
      uVar16 = 0;
      for (iVar20 = 0; iVar20 < ((this->field_0).repeated_int64_value)->current_size_;
          iVar20 = iVar20 + 1) {
        puVar12 = (ulong *)RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar20);
        lVar15 = 0x3f;
        if ((*puVar12 | 1) != 0) {
          for (; (*puVar12 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        uVar16 = uVar16 + ((int)lVar15 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_UINT64:
      uVar16 = 0;
      for (iVar20 = 0; iVar20 < ((this->field_0).repeated_uint64_value)->current_size_;
          iVar20 = iVar20 + 1) {
        puVar13 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,iVar20);
        lVar15 = 0x3f;
        if ((*puVar13 | 1) != 0) {
          for (; (*puVar13 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        uVar16 = uVar16 + ((int)lVar15 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_INT32:
      uVar16 = 0;
      for (iVar20 = 0; iVar20 < ((this->field_0).repeated_int32_value)->current_size_;
          iVar20 = iVar20 + 1) {
        piVar6 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar20);
        sVar5 = io::CodedOutputStream::VarintSize32SignExtended(*piVar6);
        uVar16 = uVar16 + sVar5;
      }
      break;
    case TYPE_BOOL:
      uVar16 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x647);
      other = LogMessage::operator<<(&local_68,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_29,other);
      LogMessage::~LogMessage(&local_68);
    default:
      this->cached_size = 0;
      return 0;
    case TYPE_UINT32:
      uVar16 = 0;
      for (iVar20 = 0; iVar20 < ((this->field_0).repeated_uint32_value)->current_size_;
          iVar20 = iVar20 + 1) {
        puVar7 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar20);
        iVar3 = 0x1f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar16 = uVar16 + (iVar3 * 9 + 0x49U >> 6);
      }
      break;
    case TYPE_ENUM:
      uVar16 = 0;
      for (iVar20 = 0; iVar20 < ((this->field_0).repeated_int32_value)->current_size_;
          iVar20 = iVar20 + 1) {
        piVar6 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar20);
        sVar5 = io::CodedOutputStream::VarintSize32SignExtended(*piVar6);
        uVar16 = uVar16 + sVar5;
      }
      break;
    case TYPE_SINT32:
      uVar16 = 0;
      for (iVar20 = 0; iVar20 < ((this->field_0).repeated_int32_value)->current_size_;
          iVar20 = iVar20 + 1) {
        piVar6 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar20);
        sVar5 = WireFormatLite::SInt32Size(*piVar6);
        uVar16 = uVar16 + sVar5;
      }
      break;
    case MAX_FIELD_TYPE:
      uVar16 = 0;
      for (iVar20 = 0; iVar20 < ((this->field_0).repeated_int64_value)->current_size_;
          iVar20 = iVar20 + 1) {
        plVar9 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar20);
        sVar5 = WireFormatLite::SInt64Size(*plVar9);
        uVar16 = uVar16 + sVar5;
      }
    }
    this->cached_size = (uint)uVar16;
    if (uVar16 == 0) {
      return 0;
    }
    uVar4 = (uint)uVar16 | 1;
    iVar20 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar20 == 0; iVar20 = iVar20 + -1) {
      }
    }
    pvVar10 = (void *)(ulong)(iVar20 * 9 + 0x49U >> 6);
    uVar4 = number * 8 + 3;
    iVar20 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar20 == 0; iVar20 = iVar20 + -1) {
      }
    }
    sVar5 = uVar16 + (iVar20 * 9 + 0x49U >> 6);
    goto LAB_0026c4a7;
  }
  if ((this->field_0xa & 1) != 0) {
    return 0;
  }
  FVar2 = anon_unknown_22::real_type(this->type);
  sVar5 = WireFormatLite::TagSize(number,FVar2);
  FVar2 = anon_unknown_22::real_type(this->type);
  switch(FVar2) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    return sVar5 + 8;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    return sVar5 + 4;
  case TYPE_INT64:
  case TYPE_UINT64:
    uVar16 = (this->field_0).uint64_value | 1;
    lVar15 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    iVar20 = (int)lVar15;
    goto LAB_0026c49e;
  case TYPE_INT32:
  case TYPE_ENUM:
    pvVar10 = (void *)io::CodedOutputStream::VarintSize32SignExtended((this->field_0).int32_value);
    break;
  case TYPE_BOOL:
    return sVar5 + 1;
  case TYPE_STRING:
    pvVar10 = (void *)WireFormatLite::StringSize((this->field_0).string_value);
    break;
  case TYPE_GROUP:
    pvVar10 = (*(((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)->
                impl_).options_.block_alloc)((size_t)(this->field_0).repeated_string_value);
    break;
  case TYPE_MESSAGE:
    if ((this->field_0xa & 0x10) != 0) {
      iVar20 = (*((MessageLite *)(this->field_0).repeated_string_value)->_vptr_MessageLite[0xb])();
      uVar16 = CONCAT44(extraout_var_00,iVar20);
      sVar5 = sVar5 + uVar16;
      goto LAB_0026c498;
    }
    pvVar10 = (void *)WireFormatLite::MessageSize<google::protobuf::MessageLite>
                                ((MessageLite *)(this->field_0).repeated_string_value);
    break;
  case TYPE_BYTES:
    pvVar10 = (void *)WireFormatLite::BytesSize((this->field_0).string_value);
    break;
  case TYPE_UINT32:
    uVar16 = (ulong)(this->field_0).uint32_value;
LAB_0026c498:
    uVar4 = (uint)uVar16 | 1;
    iVar20 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar20 == 0; iVar20 = iVar20 + -1) {
      }
    }
LAB_0026c49e:
    pvVar10 = (void *)(ulong)(iVar20 * 9 + 0x49U >> 6);
    break;
  case TYPE_SINT32:
    pvVar10 = (void *)WireFormatLite::SInt32Size((this->field_0).int32_value);
    break;
  case MAX_FIELD_TYPE:
    pvVar10 = (void *)WireFormatLite::SInt64Size((this->field_0).int64_value);
    break;
  default:
    goto switchD_0026bfcd_default;
  }
LAB_0026c4a7:
  sVar5 = sVar5 + (long)pvVar10;
switchD_0026bfcd_default:
  return sVar5;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) { \
      result += WireFormatLite::CAMELCASE##Size(                     \
          repeated_##LOWERCASE##_value->Get(i));                     \
    }                                                                \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += WireFormatLite::k##CAMELCASE##Size *               \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = ToCachedSize(result);
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    result += tag_size * FromIntSize(repeated_##LOWERCASE##_value->size()); \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {        \
      result += WireFormatLite::CAMELCASE##Size(                            \
          repeated_##LOWERCASE##_value->Get(i));                            \
    }                                                                       \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
        HANDLE_TYPE(ENUM, Enum, enum);
        HANDLE_TYPE(GROUP, Group, message);
        HANDLE_TYPE(MESSAGE, Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *  \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)      \
  case WireFormatLite::TYPE_##UPPERCASE:                  \
    result += WireFormatLite::CAMELCASE##Size(LOWERCASE); \
    break

      HANDLE_TYPE(INT32, Int32, int32_value);
      HANDLE_TYPE(INT64, Int64, int64_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_value);
      HANDLE_TYPE(SINT32, SInt32, int32_value);
      HANDLE_TYPE(SINT64, SInt64, int64_value);
      HANDLE_TYPE(STRING, String, *string_value);
      HANDLE_TYPE(BYTES, Bytes, *string_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
      HANDLE_TYPE(GROUP, Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          size_t size = lazymessage_value->ByteSizeLong();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)         \
  case WireFormatLite::TYPE_##UPPERCASE:          \
    result += WireFormatLite::k##CAMELCASE##Size; \
    break
        HANDLE_TYPE(FIXED32, Fixed32);
        HANDLE_TYPE(FIXED64, Fixed64);
        HANDLE_TYPE(SFIXED32, SFixed32);
        HANDLE_TYPE(SFIXED64, SFixed64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}